

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O1

void __thiscall antlr::CharScanner::match(CharScanner *this,char *s)

{
  byte bVar1;
  char cVar2;
  uint c;
  MismatchedCharException *this_00;
  char *pcVar3;
  
  if (*s != '\0') {
    pcVar3 = s + 1;
    do {
      c = (*(this->super_TokenStream)._vptr_TokenStream[3])(this,1);
      bVar1 = pcVar3[-1];
      if (c != bVar1) {
        this_00 = (MismatchedCharException *)__cxa_allocate_exception(0x90);
        MismatchedCharException::MismatchedCharException(this_00,c,(uint)bVar1,false,this);
        __cxa_throw(this_00,&MismatchedCharException::typeinfo,
                    MismatchedCharException::~MismatchedCharException);
      }
      (*(this->super_TokenStream)._vptr_TokenStream[8])(this);
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
  }
  return;
}

Assistant:

virtual void match( const char* s )
	{
		while( *s != '\0' )
		{
			// the & 0xFF is here to prevent sign extension lateron
			int la_1 = LA(1), c = (*s++ & 0xFF);

			if ( la_1 != c )
				throw MismatchedCharException(la_1, c, false, this);

			consume();
		}
	}